

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O1

void __thiscall
AddressFactory_GetAddressByLockingScript_Test::TestBody
          (AddressFactory_GetAddressByLockingScript_Test *this)

{
  bool bVar1;
  AssertHelperData *pAVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Script script;
  AddressFactory factory;
  Address address;
  AssertHelper local_3a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_3a0;
  undefined1 local_398 [24];
  AssertHelper local_380;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  undefined1 local_370 [16];
  uchar *local_360 [2];
  uchar local_350 [16];
  void *local_340;
  void *local_328;
  void *local_310;
  code *local_2f8 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_280;
  Script local_268;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  Script local_1f8;
  AddressFactory local_1c0;
  Address local_198 [4];
  undefined4 local_194;
  undefined1 *local_188;
  undefined1 local_178 [16];
  void *local_168;
  long local_160;
  void *local_150;
  void *local_138;
  code *local_120 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a8;
  Script local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  
  cfd::AddressFactory::AddressFactory(&local_1c0);
  cfd::core::Script::Script(&local_1f8);
  cfd::core::Address::Address(local_198);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac","");
  cfd::core::Script::Script((Script *)local_370,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_1f8,(Script *)local_370);
  cfd::core::Script::~Script((Script *)local_370);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_370);
      cfd::core::Address::operator=(local_198,(Address *)local_370);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_228);
      cfd::core::Script::~Script(&local_268);
      local_2f8[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_280);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2f8);
      if (local_310 != (void *)0x0) {
        operator_delete(local_310);
      }
      if (local_328 != (void *)0x0) {
        operator_delete(local_328);
      }
      if (local_340 != (void *)0x0) {
        operator_delete(local_340);
      }
      if (local_360[0] != local_350) {
        operator_delete(local_360[0]);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x219,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar3 = local_160 - (long)local_168;
  if (uVar3 == 0) {
    pAVar2 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar2 = (AssertHelperData *)operator_new(uVar3);
  }
  local_398._0_8_ = uVar3 + (long)pAVar2;
  sVar4 = local_160 - (long)local_168;
  local_3a8.data_ = pAVar2;
  if (sVar4 != 0) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar2;
    memmove(pAVar2,local_168,sVar4);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)pAVar2 + sVar4);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",(char *)local_370._0_8_,
             "49a011f97ba520dab063f309bad59daeb30de101");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x21a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_194;
  local_380.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_370,"address.GetAddressType()","AddressType::kP2pkhAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_380);
  if (local_370[0] == '\0') {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_370._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_370._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x21b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
      local_3a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_370 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",(char *)local_370._0_8_,
             "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_370);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x21c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"76a91449a011f97ba520dab063f309bad59daeb30de10188ac","");
  cfd::core::Script::Script((Script *)local_370,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_1f8,(Script *)local_370);
  cfd::core::Script::~Script((Script *)local_370);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_370);
      cfd::core::Address::operator=(local_198,(Address *)local_370);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_228);
      cfd::core::Script::~Script(&local_268);
      local_2f8[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_280);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2f8);
      if (local_310 != (void *)0x0) {
        operator_delete(local_310);
      }
      if (local_328 != (void *)0x0) {
        operator_delete(local_328);
      }
      if (local_340 != (void *)0x0) {
        operator_delete(local_340);
      }
      if (local_360[0] != local_350) {
        operator_delete(local_360[0]);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x21f,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar3 = local_160 - (long)local_168;
  if (uVar3 == 0) {
    pAVar2 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar2 = (AssertHelperData *)operator_new(uVar3);
  }
  local_398._0_8_ = uVar3 + (long)pAVar2;
  sVar4 = local_160 - (long)local_168;
  local_3a8.data_ = pAVar2;
  if (sVar4 != 0) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar2;
    memmove(pAVar2,local_168,sVar4);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)pAVar2 + sVar4);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",(char *)local_370._0_8_,
             "49a011f97ba520dab063f309bad59daeb30de101");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x220,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_194;
  local_380.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_370,"address.GetAddressType()","AddressType::kP2pkhAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_380);
  if (local_370[0] == '\0') {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_370._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_370._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x221,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
      local_3a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_370 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",(char *)local_370._0_8_,
             "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_370);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x222,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487","");
  cfd::core::Script::Script((Script *)local_370,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_1f8,(Script *)local_370);
  cfd::core::Script::~Script((Script *)local_370);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_370);
      cfd::core::Address::operator=(local_198,(Address *)local_370);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_228);
      cfd::core::Script::~Script(&local_268);
      local_2f8[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_280);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2f8);
      if (local_310 != (void *)0x0) {
        operator_delete(local_310);
      }
      if (local_328 != (void *)0x0) {
        operator_delete(local_328);
      }
      if (local_340 != (void *)0x0) {
        operator_delete(local_340);
      }
      if (local_360[0] != local_350) {
        operator_delete(local_360[0]);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x225,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar3 = local_160 - (long)local_168;
  if (uVar3 == 0) {
    pAVar2 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar2 = (AssertHelperData *)operator_new(uVar3);
  }
  local_398._0_8_ = uVar3 + (long)pAVar2;
  sVar4 = local_160 - (long)local_168;
  local_3a8.data_ = pAVar2;
  if (sVar4 != 0) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar2;
    memmove(pAVar2,local_168,sVar4);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)pAVar2 + sVar4);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"address.GetHash().GetHex().c_str()",
             "\"f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4\"",(char *)local_370._0_8_,
             "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x226,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_194;
  local_380.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_370,"address.GetAddressType()","AddressType::kP2shAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_380);
  if (local_370[0] == '\0') {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_370._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_370._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x227,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
      local_3a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_370 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw\"",(char *)local_370._0_8_,
             "3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_370);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x228,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"0014925d4028880bd0c9d68fbc7fc7dfee976698629c","");
  cfd::core::Script::Script((Script *)local_370,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_1f8,(Script *)local_370);
  cfd::core::Script::~Script((Script *)local_370);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_370);
      cfd::core::Address::operator=(local_198,(Address *)local_370);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_228);
      cfd::core::Script::~Script(&local_268);
      local_2f8[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_280);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2f8);
      if (local_310 != (void *)0x0) {
        operator_delete(local_310);
      }
      if (local_328 != (void *)0x0) {
        operator_delete(local_328);
      }
      if (local_340 != (void *)0x0) {
        operator_delete(local_340);
      }
      if (local_360[0] != local_350) {
        operator_delete(local_360[0]);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x22b,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar3 = local_160 - (long)local_168;
  if (uVar3 == 0) {
    pAVar2 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar2 = (AssertHelperData *)operator_new(uVar3);
  }
  local_398._0_8_ = uVar3 + (long)pAVar2;
  sVar4 = local_160 - (long)local_168;
  local_3a8.data_ = pAVar2;
  if (sVar4 != 0) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar2;
    memmove(pAVar2,local_168,sVar4);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)pAVar2 + sVar4);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"address.GetHash().GetHex().c_str()",
             "\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",(char *)local_370._0_8_,
             "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x22c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_194;
  local_380.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_370,"address.GetAddressType()","AddressType::kP2wpkhAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_380);
  if (local_370[0] == '\0') {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_370._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_370._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x22d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
      local_3a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_370 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",(char *)local_370._0_8_,
             "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_370);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x22e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437","");
  cfd::core::Script::Script((Script *)local_370,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_1f8,(Script *)local_370);
  cfd::core::Script::~Script((Script *)local_370);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_370);
      cfd::core::Address::operator=(local_198,(Address *)local_370);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_228);
      cfd::core::Script::~Script(&local_268);
      local_2f8[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_280);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2f8);
      if (local_310 != (void *)0x0) {
        operator_delete(local_310);
      }
      if (local_328 != (void *)0x0) {
        operator_delete(local_328);
      }
      if (local_340 != (void *)0x0) {
        operator_delete(local_340);
      }
      if (local_360[0] != local_350) {
        operator_delete(local_360[0]);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x231,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar3 = local_160 - (long)local_168;
  if (uVar3 == 0) {
    pAVar2 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar2 = (AssertHelperData *)operator_new(uVar3);
  }
  local_398._0_8_ = uVar3 + (long)pAVar2;
  sVar4 = local_160 - (long)local_168;
  local_3a8.data_ = pAVar2;
  if (sVar4 != 0) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar2;
    memmove(pAVar2,local_168,sVar4);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)pAVar2 + sVar4);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"address.GetHash().GetHex().c_str()",
             "\"87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437\"",
             (char *)local_370._0_8_,
             "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x232,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_194;
  local_380.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_370,"address.GetAddressType()","AddressType::kP2wshAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_380);
  if (local_370[0] == '\0') {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_370._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_370._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x233,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
      local_3a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_370 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a\"",
             (char *)local_370._0_8_,
             "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_370);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x234,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb","");
  cfd::core::Script::Script((Script *)local_370,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_1f8,(Script *)local_370);
  cfd::core::Script::~Script((Script *)local_370);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_370);
      cfd::core::Address::operator=(local_198,(Address *)local_370);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_228);
      cfd::core::Script::~Script(&local_268);
      local_2f8[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_280);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2f8);
      if (local_310 != (void *)0x0) {
        operator_delete(local_310);
      }
      if (local_328 != (void *)0x0) {
        operator_delete(local_328);
      }
      if (local_340 != (void *)0x0) {
        operator_delete(local_340);
      }
      if (local_360[0] != local_350) {
        operator_delete(local_360[0]);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x237,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar3 = local_160 - (long)local_168;
  if (uVar3 == 0) {
    pAVar2 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar2 = (AssertHelperData *)operator_new(uVar3);
  }
  local_398._0_8_ = uVar3 + (long)pAVar2;
  sVar4 = local_160 - (long)local_168;
  local_3a8.data_ = pAVar2;
  if (sVar4 != 0) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar2;
    memmove(pAVar2,local_168,sVar4);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)pAVar2 + sVar4);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"address.GetHash().GetHex().c_str()",
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             (char *)local_370._0_8_,
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x238,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_194;
  local_380.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_370,"address.GetAddressType()","AddressType::kTaprootAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_380);
  if (local_370[0] == '\0') {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_370._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_370._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x239,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
      local_3a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_370 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4\"",
             (char *)local_370._0_8_,
             "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_370);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x23a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799","");
  cfd::core::Script::Script((Script *)local_370,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_1f8,(Script *)local_370);
  cfd::core::Script::~Script((Script *)local_370);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_370);
      cfd::core::Address::operator=(local_198,(Address *)local_370);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_228);
      cfd::core::Script::~Script(&local_268);
      local_2f8[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_280);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2f8);
      if (local_310 != (void *)0x0) {
        operator_delete(local_310);
      }
      if (local_328 != (void *)0x0) {
        operator_delete(local_328);
      }
      if (local_340 != (void *)0x0) {
        operator_delete(local_340);
      }
      if (local_360[0] != local_350) {
        operator_delete(local_360[0]);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x23d,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar3 = local_160 - (long)local_168;
  if (uVar3 == 0) {
    pAVar2 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar2 = (AssertHelperData *)operator_new(uVar3);
  }
  local_398._0_8_ = uVar3 + (long)pAVar2;
  sVar4 = local_160 - (long)local_168;
  local_3a8.data_ = pAVar2;
  if (sVar4 != 0) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar2;
    memmove(pAVar2,local_168,sVar4);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)pAVar2 + sVar4);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"address.GetHash().GetHex().c_str()",
             "\"88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799\"",
             (char *)local_370._0_8_,
             "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_380.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_378.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_378.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x23e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_194;
  local_380.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_370,"address.GetAddressType()","AddressType::kTaprootAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_380);
  if (local_370[0] == '\0') {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_370._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_370._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x23f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
      local_3a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_370 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah\"",
             (char *)local_370._0_8_,
             "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
  if ((uchar **)local_370._0_8_ != local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_370);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x240,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((uchar **)local_370._0_8_ != (uchar **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((uchar **)local_370._0_8_ != (uchar **)0x0)) {
        (**(code **)(*(uchar **)local_370._0_8_ + 8))();
      }
      local_370._0_8_ = (uchar **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50);
  cfd::core::Script::~Script(&local_90);
  local_120[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_a8);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_120);
  if (local_138 != (void *)0x0) {
    operator_delete(local_138);
  }
  if (local_150 != (void *)0x0) {
    operator_delete(local_150);
  }
  if (local_168 != (void *)0x0) {
    operator_delete(local_168);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  cfd::core::Script::~Script(&local_1f8);
  local_1c0._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_002dffd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_1c0.prefix_list_);
  return;
}

Assistant:

TEST(AddressFactory, GetAddressByLockingScript)
{
  AddressFactory factory;
  Script script;
  Address address;

  script = Script("210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("76a91449a011f97ba520dab063f309bad59daeb30de10188ac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2shAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");

  script = Script("0014925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");

  script = Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wshAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  
  script = Script("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  
  script = Script("512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
}